

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setAllPagerFlags(sqlite3 *db)

{
  uint pgFlags;
  long in_RDI;
  int n;
  Db *pDb;
  uint uVar1;
  Btree *p;
  
  if (*(char *)(in_RDI + 0x65) != '\0') {
    p = *(Btree **)(in_RDI + 0x20);
    uVar1 = *(uint *)(in_RDI + 0x28);
    while (pgFlags = uVar1 - 1, 0 < (int)uVar1) {
      if (p->pBt != (BtShared *)0x0) {
        sqlite3BtreeSetPagerFlags(p,pgFlags);
      }
      p = (Btree *)&p->pNext;
      uVar1 = pgFlags;
    }
  }
  return;
}

Assistant:

static void setAllPagerFlags(sqlite3 *db){
  if( db->autoCommit ){
    Db *pDb = db->aDb;
    int n = db->nDb;
    assert( SQLITE_FullFSync==PAGER_FULLFSYNC );
    assert( SQLITE_CkptFullFSync==PAGER_CKPT_FULLFSYNC );
    assert( SQLITE_CacheSpill==PAGER_CACHESPILL );
    assert( (PAGER_FULLFSYNC | PAGER_CKPT_FULLFSYNC | PAGER_CACHESPILL)
             ==  PAGER_FLAGS_MASK );
    assert( (pDb->safety_level & PAGER_SYNCHRONOUS_MASK)==pDb->safety_level );
    while( (n--) > 0 ){
      if( pDb->pBt ){
        sqlite3BtreeSetPagerFlags(pDb->pBt,
                 pDb->safety_level | (db->flags & PAGER_FLAGS_MASK) );
      }
      pDb++;
    }
  }
}